

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall
cmMakefile::EnforceUniqueName(cmMakefile *this,string *name,string *msg,bool isCustom)

{
  cmState *this_00;
  bool bVar1;
  byte bVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  cmTarget *pcVar5;
  ulong uVar6;
  char *pcVar7;
  PolicyID id;
  byte unaff_R13B;
  ostringstream e;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  bVar1 = IsAlias(this,name);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"cannot create target \"",0x16);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"\" because an alias with the same name already exists.",0x35);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)msg,(string *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar2 = 0;
    goto LAB_0039f4d6;
  }
  pcVar5 = FindTargetToUse(this,name,false);
  if (pcVar5 != (cmTarget *)0x0) {
    if (pcVar5->IsImportedTarget == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"cannot create target \"",0x16);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"\" because an imported target with the same name already exists.",0x3f);
      std::__cxx11::stringbuf::str();
LAB_0039f3f2:
      std::__cxx11::string::operator=((string *)msg,(string *)local_1c8);
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      unaff_R13B = 0;
    }
    else {
      PVar3 = cmState::Snapshot::GetPolicy(&this->StateSnapshot,CMP0002);
      unaff_R13B = 1;
      if (PVar3 - REQUIRED_IF_USED < 2) {
        cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1a8,(cmPolicies *)0x2,id);
        IssueMessage(this,FATAL_ERROR,(string *)local_1a8,false);
      }
      else {
        if (PVar3 == OLD) goto LAB_0039f4cd;
        if (PVar3 != WARN) {
          if (((isCustom) && (pcVar5->TargetTypeValue == UTILITY)) && (pcVar5->Makefile != this)) {
            this_00 = this->GlobalGenerator->CMakeInstance->State;
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"ALLOW_DUPLICATE_CUSTOM_TARGETS","");
            bVar1 = cmState::GetGlobalPropertyAsBool(this_00,(string *)local_1a8);
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
            }
            if (bVar1) goto LAB_0039f4cd;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"cannot create target \"",0x16);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"\" because another target with the same name already exists.  ",0x3d);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"The existing target is ",0x17);
          uVar6 = (ulong)pcVar5->TargetTypeValue;
          if ((uVar6 < 8) && ((0xafU >> (pcVar5->TargetTypeValue & 0x1f) & 1) != 0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,&DAT_004e0330 + *(int *)(&DAT_004e0330 + uVar6 * 4),
                       *(long *)(&DAT_004e0350 + uVar6 * 8));
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"created in source directory \"",0x1d);
          pcVar7 = GetCurrentSourceDirectory(pcVar5->Makefile);
          poVar4 = std::operator<<((ostream *)local_1a8,pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"See documentation for policy CMP0002 for more details.",0x36);
          std::__cxx11::stringbuf::str();
          goto LAB_0039f3f2;
        }
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1a8,(cmPolicies *)0x2,id);
        IssueMessage(this,AUTHOR_WARNING,(string *)local_1a8,false);
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
    }
  }
LAB_0039f4cd:
  bVar2 = pcVar5 == (cmTarget *)0x0 | unaff_R13B;
LAB_0039f4d6:
  return (bool)(bVar2 & 1);
}

Assistant:

bool cmMakefile::EnforceUniqueName(std::string const& name, std::string& msg,
                                   bool isCustom) const
{
  if(this->IsAlias(name))
    {
    std::ostringstream e;
    e << "cannot create target \"" << name
      << "\" because an alias with the same name already exists.";
    msg = e.str();
    return false;
    }
  if(cmTarget* existing = this->FindTargetToUse(name))
    {
    // The name given conflicts with an existing target.  Produce an
    // error in a compatible way.
    if(existing->IsImported())
      {
      // Imported targets were not supported in previous versions.
      // This is new code, so we can make it an error.
      std::ostringstream e;
      e << "cannot create target \"" << name
        << "\" because an imported target with the same name already exists.";
      msg = e.str();
      return false;
      }
    else
      {
      // target names must be globally unique
      switch (this->GetPolicyStatus(cmPolicies::CMP0002))
        {
        case cmPolicies::WARN:
          this->IssueMessage(cmake::AUTHOR_WARNING, cmPolicies::
                             GetPolicyWarning(cmPolicies::CMP0002));
        case cmPolicies::OLD:
          return true;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          this->IssueMessage(cmake::FATAL_ERROR,
            cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0002)
            );
          return true;
        case cmPolicies::NEW:
          break;
        }

      // The conflict is with a non-imported target.
      // Allow this if the user has requested support.
      cmake* cm = this->GetCMakeInstance();
      if(isCustom && existing->GetType() == cmState::UTILITY &&
         this != existing->GetMakefile() &&
         cm->GetState()
           ->GetGlobalPropertyAsBool("ALLOW_DUPLICATE_CUSTOM_TARGETS"))
        {
        return true;
        }

      // Produce an error that tells the user how to work around the
      // problem.
      std::ostringstream e;
      e << "cannot create target \"" << name
        << "\" because another target with the same name already exists.  "
        << "The existing target is ";
      switch(existing->GetType())
        {
        case cmState::EXECUTABLE:
          e << "an executable ";
          break;
        case cmState::STATIC_LIBRARY:
          e << "a static library ";
          break;
        case cmState::SHARED_LIBRARY:
          e << "a shared library ";
          break;
        case cmState::MODULE_LIBRARY:
          e << "a module library ";
          break;
        case cmState::UTILITY:
          e << "a custom target ";
          break;
        case cmState::INTERFACE_LIBRARY:
          e << "an interface library ";
          break;
        default: break;
        }
      e << "created in source directory \""
        << existing->GetMakefile()->GetCurrentSourceDirectory() << "\".  "
        << "See documentation for policy CMP0002 for more details.";
      msg = e.str();
      return false;
      }
    }
  return true;
}